

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

boolean check_room(level *lev,xchar *lowx,xchar *ddx,xchar *lowy,xchar *ddy,boolean vault)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_64;
  int ymax;
  int ylim;
  int xlim;
  rm *loc;
  int local_48;
  int hiy;
  int hix;
  int y;
  int x;
  boolean vault_local;
  xchar *ddy_local;
  xchar *lowy_local;
  xchar *ddx_local;
  xchar *lowx_local;
  level *lev_local;
  
  local_48 = (int)*lowx + (int)*ddx;
  loc._4_4_ = (int)*lowy + (int)*ddy;
  iVar1 = (vault != '\0') + 4;
  iVar2 = (vault != '\0') + 3;
  if (*lowx < '\x03') {
    *lowx = '\x03';
  }
  if (*lowy < '\x02') {
    *lowy = '\x02';
  }
  if (0x4d < local_48) {
    local_48 = 0x4d;
  }
  if (0x12 < loc._4_4_) {
    loc._4_4_ = 0x12;
  }
LAB_002dfa08:
  if ((*lowx < local_48) && (*lowy < loc._4_4_)) {
    for (hix = *lowx - iVar1; hix <= local_48 + iVar1; hix = hix + 1) {
      if ((0 < hix) && (hix < 0x50)) {
        hiy = *lowy - iVar2;
        local_64 = loc._4_4_ + iVar2;
        if (hiy < 0) {
          hiy = 0;
        }
        if (0x14 < local_64) {
          local_64 = 0x14;
        }
        _ylim = lev->locations[hix] + hiy;
        for (; hiy <= local_64; hiy = hiy + 1) {
          if (_ylim->typ != '\0') {
            iVar3 = rn2(3);
            if (iVar3 == 0) {
              return '\0';
            }
            if (hix < *lowx) {
              *lowx = (char)hix + (char)iVar1 + '\x01';
            }
            else {
              local_48 = (hix - iVar1) + -1;
            }
            if (hiy < *lowy) {
              *lowy = (char)hiy + (char)iVar2 + '\x01';
            }
            else {
              loc._4_4_ = (hiy - iVar2) + -1;
            }
            goto LAB_002dfa08;
          }
          _ylim = _ylim + 1;
        }
      }
    }
    *ddx = (char)local_48 - *lowx;
    *ddy = (char)loc._4_4_ - *lowy;
    lev_local._7_1_ = '\x01';
  }
  else {
    lev_local._7_1_ = '\0';
  }
  return lev_local._7_1_;
}

Assistant:

boolean check_room(struct level *lev, xchar *lowx, xchar *ddx,
		   xchar *lowy, xchar *ddy, boolean vault)
{
	int x, y, hix = *lowx + *ddx, hiy = *lowy + *ddy;
	struct rm *loc;
	int xlim, ylim, ymax;

	xlim = XLIM + (vault ? 1 : 0);
	ylim = YLIM + (vault ? 1 : 0);

	if (*lowx < 3)		*lowx = 3;
	if (*lowy < 2)		*lowy = 2;
	if (hix > COLNO-3)	hix = COLNO - 3;
	if (hiy > ROWNO-3)	hiy = ROWNO - 3;
chk:
	if (hix <= *lowx || hiy <= *lowy)	return FALSE;

	/* check area around room (and make room smaller if necessary) */
	for (x = *lowx - xlim; x <= hix + xlim; x++) {
		if (x <= 0 || x >= COLNO) continue;
		y = *lowy - ylim;
		ymax = hiy + ylim;
		if (y < 0)
		    y = 0;
		if (ymax >= ROWNO)
		    ymax = ROWNO - 1;
		loc = &lev->locations[x][y];
		
		for (; y <= ymax; y++) {
			if (loc++->typ) {
				if (!rn2(3))
				    return FALSE;

				if (x < *lowx)
				    *lowx = x + xlim + 1;
				else
				    hix = x - xlim - 1;
				if (y < *lowy)
				    *lowy = y + ylim + 1;
				else
				    hiy = y - ylim - 1;
				goto chk;
			}
		}
	}
	*ddx = hix - *lowx;
	*ddy = hiy - *lowy;
	return TRUE;
}